

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stop.c
# Opt level: O2

location_type_t parse_location_type(char *value)

{
  byte bVar1;
  location_type_t lVar2;
  
  bVar1 = *value;
  lVar2 = (location_type_t)bVar1;
  if (bVar1 != 0) {
    if (bVar1 == 0x32) {
      return LT_NOT_SET - (value[1] == '\0');
    }
    if (bVar1 == 0x31) {
      return (uint)(value[1] != '\0') * 2 + LT_STATION;
    }
    if (bVar1 == 0x30) {
      return (uint)(value[1] != '\0') * 3;
    }
    lVar2 = LT_NOT_SET;
  }
  return lVar2;
}

Assistant:

location_type_t parse_location_type(const char *value) {
    if (strcmp(value, "0") == 0 || strcmp(value, "") == 0)
        return LT_STOP;
    else if (strcmp(value, "1") == 0)
        return LT_STATION;
    else if (strcmp(value, "2") == 0)
        return LT_STATION_ENTRANCE_EXIT;
    else
        return LT_NOT_SET;
}